

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

string * anon_unknown.dwarf_29c37::openFile(string *fileName)

{
  byte bVar1;
  ostream *poVar2;
  string *in_RSI;
  string *in_RDI;
  ifstream *fileStream;
  
  std::ifstream::ifstream(in_RDI);
  std::ifstream::open(in_RDI,(_Ios_Openmode)in_RSI);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open file ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return in_RDI;
}

Assistant:

ifstream openFile(const string & fileName) {
        ifstream fileStream;
        fileStream.open(fileName, fstream::in);
        if (fileStream.fail()) {
            cout << "Can't open file " << fileName << endl;
            exit(1);
        }
        return fileStream;
    }